

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validatePoolingLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  pointer pcVar1;
  bool bVar2;
  LayerUnion LVar3;
  long *plVar4;
  size_type *psVar5;
  string err;
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  undefined1 local_88 [24];
  string local_70;
  string local_50;
  
  Result::Result(__return_storage_ptr__);
  validateInputCount((Result *)local_98,layer,1,1);
  __return_storage_ptr__->m_type = local_98._0_4_;
  __return_storage_ptr__->m_reason = local_98._4_4_;
  this_00 = &__return_storage_ptr__->m_message;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_90);
  pcVar1 = local_88 + 8;
  if (local_90._M_p != pcVar1) {
    operator_delete(local_90._M_p,local_88._8_8_ + 1);
  }
  bVar2 = Result::good(__return_storage_ptr__);
  if (bVar2) {
    validateOutputCount((Result *)local_98,layer,1,1);
    __return_storage_ptr__->m_type = local_98._0_4_;
    __return_storage_ptr__->m_reason = local_98._4_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_90);
    if (local_90._M_p != pcVar1) {
      operator_delete(local_90._M_p,local_88._8_8_ + 1);
    }
    bVar2 = Result::good(__return_storage_ptr__);
    if (bVar2) {
      if (this->ndArrayInterpretation == true) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Pooling","");
        validateInputOutputRankEquality((Result *)local_98,layer,&local_50,&this->blobNameToRank);
        __return_storage_ptr__->m_type = local_98._0_4_;
        __return_storage_ptr__->m_reason = local_98._4_4_;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_90);
        if (local_90._M_p != pcVar1) {
          operator_delete(local_90._M_p,local_88._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        bVar2 = Result::good(__return_storage_ptr__);
        if (!bVar2) {
          return __return_storage_ptr__;
        }
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Pooling","");
        validateRankCount((Result *)local_98,layer,&local_70,4,-1,&this->blobNameToRank);
        __return_storage_ptr__->m_type = local_98._0_4_;
        __return_storage_ptr__->m_reason = local_98._4_4_;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_90);
        if (local_90._M_p != pcVar1) {
          operator_delete(local_90._M_p,local_88._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        bVar2 = Result::good(__return_storage_ptr__);
        if (!bVar2) {
          return __return_storage_ptr__;
        }
      }
      if (layer->_oneof_case_[0] == 0x78) {
        LVar3 = layer->layer_;
      }
      else {
        LVar3.pooling_ = Specification::PoolingLayerParams::default_instance();
      }
      if ((LVar3.pooling_)->_oneof_case_[0] == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,"Padding type for the pooling layer \'",(layer->name_).ptr_);
        plVar4 = (long *)std::__cxx11::string::append(local_98);
        psVar5 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_70.field_2._M_allocated_capacity = *psVar5;
          local_70.field_2._8_8_ = plVar4[3];
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        }
        else {
          local_70.field_2._M_allocated_capacity = *psVar5;
          local_70._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_70._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if (local_98 != (undefined1  [8])local_88) {
          operator_delete((void *)local_98,local_88._0_8_ + 1);
        }
        Result::Result((Result *)local_98,INVALID_MODEL_PARAMETERS,&local_70);
        __return_storage_ptr__->m_type = local_98._0_4_;
        __return_storage_ptr__->m_reason = local_98._4_4_;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_90);
        if (local_90._M_p != pcVar1) {
          operator_delete(local_90._M_p,local_88._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validatePoolingLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (!r.good()) {return r;}

    r = validateOutputCount(layer, 1, 1);
    if (!r.good()) {return r;}

    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Pooling", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Pooling", 4, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    // We need to check if the PoolingPaddingType is set
    if (layer.pooling().PoolingPaddingType_case() == Specification::PoolingLayerParams::PoolingPaddingTypeCase::POOLINGPADDINGTYPE_NOT_SET) {
        std::string err = "Padding type for the pooling layer '" + layer.name() + "' is not set.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return r;
}